

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

__pid_t __thiscall kj::UnixEventPort::wait(UnixEventPort *this,void *__stat_loc)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Duration unit;
  ChildSet *pCVar4;
  int *piVar5;
  undefined7 extraout_var;
  long lVar6;
  sigset_t *psVar7;
  sigset_t *psVar8;
  SignalPromiseAdapter *pSVar9;
  long in_FS_OFFSET;
  byte bVar10;
  Fault f;
  Fault f_2;
  sigset_t waitMask;
  epoll_event events [16];
  Fault local_180;
  Fault local_178;
  undefined8 uStack_170;
  sigset_t local_168;
  TimerImpl local_e8 [5];
  undefined4 extraout_var_00;
  
  bVar10 = 0;
  this->sleeping = false;
  unit.value._0_4_ = (**this->clock->_vptr_MonotonicClock)();
  unit.value._4_4_ = extraout_var_00;
  TimerImpl::timeoutToNextEvent(local_e8,(TimePoint)&this->timerImpl,unit,1000000);
  iVar2 = -1;
  if ((char)local_e8[0].super_Timer.super_MonotonicClock._vptr_MonotonicClock != '\0') {
    iVar2 = (int)local_e8[0].time.value.value;
  }
  pSVar9 = this->signalHead;
  pCVar4 = (this->childSet).ptr.ptr;
  if (pSVar9 == (SignalPromiseAdapter *)0x0 && pCVar4 == (ChildSet *)0x0) {
    iVar2 = epoll_wait((this->epollFd).fd,(epoll_event *)local_e8,0x10,iVar2);
  }
  else {
    psVar7 = &this->originalMask;
    psVar8 = &local_168;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      psVar8->__val[0] = psVar7->__val[0];
      psVar7 = (sigset_t *)((long)psVar7 + (ulong)bVar10 * -0x10 + 8);
      psVar8 = (sigset_t *)((long)psVar8 + ((ulong)bVar10 * -2 + 1) * 8);
    }
    if (pSVar9 != (SignalPromiseAdapter *)0x0) {
LAB_00403940:
      do {
        iVar3 = sigdelset(&local_168,pSVar9->signum);
        if (iVar3 < 0) {
          iVar3 = kj::_::Debug::getOsErrorNumber(false);
          if (iVar3 == -1) goto LAB_00403940;
          if (iVar3 != 0) {
            local_180.exception = (Exception *)0x0;
            local_178.exception = (Exception *)0x0;
            uStack_170 = 0;
            kj::_::Debug::Fault::init
                      (&local_180,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                      );
            kj::_::Debug::Fault::fatal(&local_180);
          }
        }
        pSVar9 = pSVar9->next;
      } while (pSVar9 != (SignalPromiseAdapter *)0x0);
      pCVar4 = (this->childSet).ptr.ptr;
    }
    if (pCVar4 != (ChildSet *)0x0) {
      do {
        iVar3 = sigdelset(&local_168,0x11);
        if (-1 < iVar3) goto LAB_004039a3;
        iVar3 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar3 == -1);
      if (iVar3 != 0) {
        local_180.exception = (Exception *)0x0;
        local_178.exception = (Exception *)0x0;
        uStack_170 = 0;
        kj::_::Debug::Fault::init
                  (&local_180,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_180);
      }
    }
LAB_004039a3:
    *(UnixEventPort **)(in_FS_OFFSET + -0x20) = this;
    iVar2 = epoll_pwait((this->epollFd).fd,(epoll_event *)local_e8,0x10,iVar2,&local_168);
    *(undefined8 *)(in_FS_OFFSET + -0x20) = 0;
  }
  if (iVar2 < 0) {
    piVar5 = __errno_location();
    iVar2 = 0;
    if (*piVar5 != 4) {
      local_178.exception = (Exception *)0x0;
      local_168.__val[0] = 0;
      local_168.__val[1] = 0;
      kj::_::Debug::Fault::init
                (&local_178,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_178);
    }
  }
  bVar1 = processEpollEvents(this,(epoll_event *)local_e8,iVar2);
  return (__pid_t)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool UnixEventPort::wait() {
  sleeping = false;

#ifdef KJ_DEBUG
  // In debug mode, verify the current signal mask matches the original.
  {
    sigset_t currentMask;
    memset(&currentMask, 0, sizeof(currentMask));
    KJ_SYSCALL(sigprocmask(0, nullptr, &currentMask));
    if (arrayPtr(currentMask).asBytes() != arrayPtr(originalMask).asBytes()) {
      kj::Vector<kj::String> changes;
      for (int i = 0; i <= SIGRTMAX; i++) {
        if (sigismember(&currentMask, i) && !sigismember(&originalMask, i)) {
          changes.add(kj::str("signal #", i, " (", strsignal(i), ") was added"));
        } else if (!sigismember(&currentMask, i) && sigismember(&originalMask, i)) {
          changes.add(kj::str("signal #", i, " (", strsignal(i), ") was removed"));
        }
      }

      KJ_FAIL_REQUIRE(
          "Signal mask has changed since UnixEventPort was constructed. You are required to "
          "ensure that whenever control returns to the event loop, the signal mask is the same "
          "as it was when UnixEventPort was created. In non-debug builds, this check is skipped, "
          "and this situation may instead lead to unexpected results. In particular, while the "
          "system is waiting for I/O events, the signal mask may be reverted to what it was at "
          "construction time, ignoring your subsequent changes.", changes);
    }
  }
#endif

  int timeout = timerImpl.timeoutToNextEvent(clock.now(), MILLISECONDS, int(maxValue))
          .map([](uint64_t t) -> int { return t; })
          .orDefault(-1);

  struct epoll_event events[16];
  int n;
  if (signalHead != nullptr || childSet != kj::none) {
    // We are interested in some signals. Use epoll_pwait().
    //
    // Note: Once upon a time, we used signalfd for this. However, this turned out to be more
    // trouble than it was worth. Some problems with signalfd:
    // - It required opening an additional file descriptor per thread.
    // - If the set of interesting signals changed, the signalfd would have to be updated before
    //   calling epoll_wait(), which was an extra syscall.
    // - When a signal arrives, it requires extra syscalls to read the signal info from the
    //   signalfd, as well as code to translate from signalfd_siginfo to siginfo_t, which are
    //   different for some reason.
    // - signalfd suffers from surprising lock contention during epoll_wait or when the signalfd's
    //   mask is updated in programs with many threads. Because the lock is a spinlock, this
    //   could consume exorbitant CPU.
    // - When a signalfd is in an epoll, it will be flagged readable based on signals which are
    //   pending in the process/thread which called epoll_ctl_add() to register the signalfd.
    //   This is mostly fine for our usage, except that it breaks one useful case that otherwise
    //   works: many servers are designed to "daemonize" themselves by fork()ing and then having
    //   the parent process exit while the child thread lives on. In this case, if a UnixEventPort
    //   had been created before daemonizing, signal handling would be forever broken in the child.

    sigset_t waitMask = originalMask;

    // Unblock the signals we care about.
    {
      auto ptr = signalHead;
      while (ptr != nullptr) {
        KJ_SYSCALL(sigdelset(&waitMask, ptr->signum));
        ptr = ptr->next;
      }
      if (childSet != kj::none) {
        KJ_SYSCALL(sigdelset(&waitMask, SIGCHLD));
      }
    }

    threadEventPort = this;
    n = epoll_pwait(epollFd, events, kj::size(events), timeout, &waitMask);
    threadEventPort = nullptr;
  } else {
    // Not waiting on any signals. Regular epoll_wait() will be fine.
    n = epoll_wait(epollFd, events, kj::size(events), timeout);
  }

  if (n < 0) {
    int error = errno;
    if (error == EINTR) {
      // We received a signal. The signal handler may have queued an event to the event loop. Even
      // if it didn't, we can't simply restart the epoll call because we need to recompute the
      // timeout. Instead, we pretend epoll_wait() returned zero events. This will cause the event
      // loop to spin once, decide it has nothing to do, recompute timeouts, then return to waiting.
      n = 0;
    } else {
      KJ_FAIL_SYSCALL("epoll_pwait()", error);
    }
  }

  return processEpollEvents(events, n);
}